

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSolNewEmpty(SUNContext sunctx)

{
  SUNNonlinearSolver_Ops p_Var1;
  SUNContext in_RDI;
  SUNNonlinearSolver_Ops ops;
  SUNNonlinearSolver NLS;
  SUNNonlinearSolver local_8;
  
  if (in_RDI == (SUNContext)0x0) {
    local_8 = (SUNNonlinearSolver)0x0;
  }
  else {
    local_8 = (SUNNonlinearSolver)malloc(0x18);
    if (local_8 == (SUNNonlinearSolver)0x0) {
      local_8 = (SUNNonlinearSolver)0x0;
    }
    else {
      p_Var1 = (SUNNonlinearSolver_Ops)malloc(0x68);
      if (p_Var1 == (SUNNonlinearSolver_Ops)0x0) {
        free(local_8);
        local_8 = (SUNNonlinearSolver)0x0;
      }
      else {
        p_Var1->gettype = (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0;
        p_Var1->initialize = (_func_int_SUNNonlinearSolver *)0x0;
        p_Var1->setup = (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0;
        p_Var1->solve =
             (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_realtype_int_void_ptr *)0x0;
        p_Var1->free = (_func_int_SUNNonlinearSolver *)0x0;
        p_Var1->setsysfn = (_func_int_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0;
        p_Var1->setlsetupfn = (_func_int_SUNNonlinearSolver_SUNNonlinSolLSetupFn *)0x0;
        p_Var1->setlsolvefn = (_func_int_SUNNonlinearSolver_SUNNonlinSolLSolveFn *)0x0;
        p_Var1->setctestfn = (_func_int_SUNNonlinearSolver_SUNNonlinSolConvTestFn_void_ptr *)0x0;
        p_Var1->setmaxiters = (_func_int_SUNNonlinearSolver_int *)0x0;
        p_Var1->getnumiters = (_func_int_SUNNonlinearSolver_long_ptr *)0x0;
        p_Var1->getcuriter = (_func_int_SUNNonlinearSolver_int_ptr *)0x0;
        p_Var1->getnumconvfails = (_func_int_SUNNonlinearSolver_long_ptr *)0x0;
        local_8->sunctx = in_RDI;
        local_8->ops = p_Var1;
        local_8->content = (void *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

SUNNonlinearSolver SUNNonlinSolNewEmpty(SUNContext sunctx)
{
  SUNNonlinearSolver     NLS;
  SUNNonlinearSolver_Ops ops;

  /* check input */
  if (!sunctx) return(NULL);

  /* create nonlinear solver object */
  NLS = NULL;
  NLS = (SUNNonlinearSolver) malloc(sizeof *NLS);
  if (NLS == NULL) return(NULL);

  /* create nonlinear solver ops structure */
  ops = NULL;
  ops = (SUNNonlinearSolver_Ops) malloc(sizeof *ops);
  if (ops == NULL) { free(NLS); return(NULL); }

  /* initialize operations to NULL */
  ops->gettype         = NULL;
  ops->initialize      = NULL;
  ops->setup           = NULL;
  ops->solve           = NULL;
  ops->free            = NULL;
  ops->setsysfn        = NULL;
  ops->setlsetupfn     = NULL;
  ops->setlsolvefn     = NULL;
  ops->setctestfn      = NULL;
  ops->setmaxiters     = NULL;
  ops->getnumiters     = NULL;
  ops->getcuriter      = NULL;
  ops->getnumconvfails = NULL;

  /* attach context and ops, initialize content to NULL */
  NLS->sunctx  = sunctx;
  NLS->ops     = ops;
  NLS->content = NULL;

  return(NLS);
}